

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O2

DVector3 * __thiscall
AActor::PosRelative(DVector3 *__return_storage_ptr__,AActor *this,sector_t *sec)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = (this->__Pos).Y;
  dVar1 = (this->__Pos).Z;
  iVar2 = this->Sector->PortalGroup;
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (iVar2 != sec->PortalGroup) {
    dVar4 = Displacements.data.Array[sec->PortalGroup * Displacements.size + iVar2].pos.X;
    dVar5 = Displacements.data.Array[sec->PortalGroup * Displacements.size + iVar2].pos.Y;
  }
  __return_storage_ptr__->X = dVar4 + (this->__Pos).X;
  __return_storage_ptr__->Y = dVar5 + dVar3;
  __return_storage_ptr__->Z = dVar1;
  return __return_storage_ptr__;
}

Assistant:

inline DVector3 AActor::PosRelative(sector_t *sec) const
{
	return Pos() + Displacements.getOffset(Sector->PortalGroup, sec->PortalGroup);
}